

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O0

cmCMakePath * __thiscall cmCMakePath::ReplaceWideExtension(cmCMakePath *this,cmCMakePath *extension)

{
  cmCMakePath *pcVar1;
  string local_48;
  string_view local_28;
  cmCMakePath *local_18;
  cmCMakePath *extension_local;
  cmCMakePath *this_local;
  
  local_18 = extension;
  extension_local = this;
  std::filesystem::__cxx11::path::string(&local_48,&extension->Path);
  local_28 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48);
  pcVar1 = ReplaceWideExtension(this,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return pcVar1;
}

Assistant:

cmCMakePath& ReplaceWideExtension(
    const cmCMakePath& extension = cmCMakePath())
  {
    return this->ReplaceWideExtension(
      static_cast<cm::string_view>(extension.Path.string()));
  }